

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_line_container.cpp
# Opt level: O2

void __thiscall LineContainer::add(LineContainer *this,ll k,ll m)

{
  ll lVar1;
  pointer pLVar2;
  ll lVar3;
  undefined1 local_38 [8];
  Line a;
  
  lVar3 = -100000000000000000;
  a.m = 100000000000000000;
  pLVar2 = (this->super_vector<Line,_std::allocator<Line>_>).
           super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  local_38 = (undefined1  [8])k;
  a.k = m;
  do {
    if ((this->super_vector<Line,_std::allocator<Line>_>).
        super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data._M_start ==
        pLVar2) {
LAB_00122c29:
      a.m = lVar3;
      std::vector<Line,_std::allocator<Line>_>::push_back
                (&this->super_vector<Line,_std::allocator<Line>_>,(value_type *)local_38);
      return;
    }
    lVar1 = isect(this,(Line *)local_38,pLVar2 + -1);
    pLVar2 = (this->super_vector<Line,_std::allocator<Line>_>).
             super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    if (pLVar2[-1].p < lVar1) {
      if ((this->super_vector<Line,_std::allocator<Line>_>).
          super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data._M_start
          != pLVar2) {
        lVar3 = isect(this,(Line *)local_38,pLVar2 + -1);
      }
      goto LAB_00122c29;
    }
    pLVar2 = pLVar2 + -1;
    (this->super_vector<Line,_std::allocator<Line>_>).
    super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data._M_finish =
         pLVar2;
  } while( true );
}

Assistant:

void add(ll k, ll m) {
        Line a = {k,m,INF};
        while(!empty() && isect(a, back()) <= back().p) pop_back();
        a.p = empty() ? (-INF) : isect(a, back());
        push_back(a);
    }